

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::ParsePurpose(AsciiParser *this,Purpose *result)

{
  bool bVar1;
  ostream *poVar2;
  string local_220;
  string local_200 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0 [32];
  ostringstream local_1c0 [8];
  ostringstream ss_e;
  undefined1 local_40 [8];
  string str;
  Purpose *result_local;
  AsciiParser *this_local;
  
  if (result == (Purpose *)0x0) {
    return false;
  }
  str.field_2._8_8_ = result;
  bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
  if (!bVar1) {
    return false;
  }
  ::std::__cxx11::string::string((string *)local_40);
  bVar1 = ReadIdentifier(this,(string *)local_40);
  if (bVar1) {
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"\"default\"");
    if (bVar1) {
      *(undefined4 *)str.field_2._8_8_ = 0;
    }
    else {
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,"\"render\"");
      if (bVar1) {
        *(undefined4 *)str.field_2._8_8_ = 1;
      }
      else {
        bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_40,"\"proxy\"");
        if (bVar1) {
          *(undefined4 *)str.field_2._8_8_ = 2;
        }
        else {
          bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_40,"\"guide\"");
          if (!bVar1) {
            ::std::__cxx11::ostringstream::ostringstream(local_1c0);
            poVar2 = ::std::operator<<((ostream *)local_1c0,"[error]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-basetype.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,"[ASCII]");
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"ParsePurpose");
            poVar2 = ::std::operator<<(poVar2,"():");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x7ff);
            ::std::operator<<(poVar2," ");
            ::std::operator+((char *)local_200,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             "Invalid purpose value: ");
            ::std::operator+(local_1e0,(char *)local_200);
            poVar2 = ::std::operator<<((ostream *)local_1c0,(string *)local_1e0);
            ::std::operator<<(poVar2,"\n");
            ::std::__cxx11::string::~string((string *)local_1e0);
            ::std::__cxx11::string::~string(local_200);
            ::std::__cxx11::ostringstream::str();
            PushError(this,&local_220);
            ::std::__cxx11::string::~string((string *)&local_220);
            this_local._7_1_ = false;
            ::std::__cxx11::ostringstream::~ostringstream(local_1c0);
            goto LAB_005df14c;
          }
          *(undefined4 *)str.field_2._8_8_ = 3;
        }
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
LAB_005df14c:
  ::std::__cxx11::string::~string((string *)local_40);
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ParsePurpose(Purpose *result) {
  if (!result) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  std::string str;
  if (!ReadIdentifier(&str)) {
    return false;
  }

  if (str == "\"default\"") {
    (*result) = Purpose::Default;
  } else if (str == "\"render\"") {
    (*result) = Purpose::Render;
  } else if (str == "\"proxy\"") {
    (*result) = Purpose::Proxy;
  } else if (str == "\"guide\"") {
    (*result) = Purpose::Guide;
  } else {
    PUSH_ERROR_AND_RETURN_TAG(kAscii, "Invalid purpose value: " + str + "\n");
  }

  return true;
}